

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_c_kernels.h
# Opt level: O2

void Sweeper_sweep_block_impl
               (SweeperLite sweeper,P *vo,P *vi,P *facexy,P *facexz,P *faceyz,P *a_from_m,
               P *m_from_a,int step,Quantities quan,Bool_t proc_x_min,Bool_t proc_x_max,
               Bool_t proc_y_min,Bool_t proc_y_max,StepInfoAll stepinfoall,
               unsigned_long do_block_init)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Dimensions dims;
  Dimensions dims_00;
  Dimensions dims_01;
  Dimensions dims_02;
  Dimensions dims_03;
  Dimensions dims_04;
  Dimensions dims_05;
  Dimensions dims_06;
  Dimensions dims_07;
  Dimensions dims_08;
  Dimensions dims_09;
  Dimensions dims_10;
  Dimensions dims_11;
  Dimensions dims_12;
  Dimensions dims_13;
  Dimensions dims_14;
  Dimensions dims_15;
  Dimensions dims_16;
  Dimensions dims_17;
  Dimensions dims_18;
  Dimensions dims_19;
  Dimensions dims_20;
  Dimensions dims_21;
  Dimensions dims_22;
  Dimensions dims_23;
  Dimensions dims_24;
  Dimensions dims_25;
  Dimensions dims_26;
  Dimensions dims_27;
  Dimensions dims_28;
  Dimensions dims_29;
  Dimensions dims_30;
  Dimensions dims_31;
  P *pPVar7;
  P *pPVar8;
  P *v;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  int i;
  int i_00;
  int i_01;
  int j;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  size_t sVar31;
  P *pPVar32;
  ulong uVar33;
  P *pPVar34;
  P *pPVar35;
  double *pdVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  int *imax;
  int iy;
  uint iy_00;
  uint uVar42;
  uint uVar43;
  long lVar44;
  uint dir;
  int iVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  uint uVar49;
  uint dir_00;
  int iVar50;
  int iVar51;
  int ia;
  long lVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  long lVar59;
  int iVar60;
  int iVar61;
  ulong uVar62;
  uint dir_01;
  uint uVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  ulong uVar67;
  bool bVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  uint in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcb0;
  int local_34c;
  uint local_318;
  uint local_310;
  int local_2d0;
  int iStack_2a4;
  P *local_238;
  P *local_230;
  P *local_228;
  uint local_1a0;
  int izmax_semiblock_up2;
  int izmin_semiblock;
  int iymax_semiblock_up2;
  int iymin_semiblock;
  int ixmax_semiblock_up2;
  int ixmin_semiblock;
  ulong local_170;
  double local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  double local_128;
  double local_120;
  P *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int izmax_semiblock;
  Bool_t is_semiblock_max_z;
  Bool_t is_semiblock_min_z;
  int iymax_semiblock;
  Bool_t is_semiblock_max_y;
  Bool_t is_semiblock_min_y;
  int ixmax_semiblock;
  Bool_t is_semiblock_max_x;
  Bool_t is_semiblock_min_x;
  ulong local_c0;
  P *local_b8;
  P *local_b0;
  long local_a8;
  ulong local_a0;
  P *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  P *local_70;
  P *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  ulong local_40;
  P *local_38;
  Bool_t *has_hi;
  int *imax_up2;
  
  local_48 = (long)sweeper.noctant_per_block;
  local_f4 = sweeper.nsemiblock;
  uVar62 = 0;
  if (0 < sweeper.nsemiblock) {
    uVar62 = (ulong)(uint)sweeper.nsemiblock;
  }
  uVar33 = 0;
  local_b8 = vo;
  local_b0 = vi;
  local_98 = a_from_m;
  do {
    if (uVar33 == uVar62) {
      return;
    }
    Sweeper_thread_octant(&sweeper);
    iVar55 = sweeper.noctant_per_block;
    Sweeper_thread_octant(&sweeper);
    uVar41 = (long)iVar55 / (long)sweeper.nthread_octant & 0xffffffff;
    local_50 = uVar33 * local_48;
    if ((int)((long)iVar55 / (long)sweeper.nthread_octant) < 1) {
      uVar41 = 0;
    }
    local_170 = uVar33;
    for (uVar67 = 0; iVar55 = local_f4, uVar67 != uVar41; uVar67 = uVar67 + 1) {
      uVar1 = stepinfoall.stepinfo[uVar67].octant;
      uVar49 = uVar1 & 1;
      dir_00 = -uVar49 | 1;
      dir_01 = -(uint)((uVar1 >> 1 & 1) != 0) | 1;
      is_semiblock_min_x = 0;
      iVar11 = stepinfoall.stepinfo[uVar67].block_z;
      is_semiblock_max_x = 0;
      iVar2 = stepinfoall.stepinfo[uVar67].is_active;
      ixmin_semiblock = 0;
      dir = -(uint)((uVar1 >> 2 & 1) != 0) | 1;
      ixmax_semiblock = 0;
      ixmax_semiblock_up2 = 0;
      Sweeper_get_semiblock_bounds
                (&is_semiblock_min_x,&is_semiblock_max_x,&ixmin_semiblock,&ixmax_semiblock,
                 &ixmax_semiblock_up2,sweeper.dims_b.ncell_x,0,dir_00,(int)local_170,local_f4);
      is_semiblock_min_y = 0;
      is_semiblock_max_y = 0;
      iymin_semiblock = 0;
      iymax_semiblock = 0;
      iymax_semiblock_up2 = 0;
      Sweeper_get_semiblock_bounds
                (&is_semiblock_min_y,&is_semiblock_max_y,&iymin_semiblock,&iymax_semiblock,
                 &iymax_semiblock_up2,sweeper.dims_b.ncell_y,1,dir_01,(int)local_170,iVar55);
      is_semiblock_min_z = 0;
      is_semiblock_max_z = 0;
      izmin_semiblock = 0;
      izmax_semiblock = 0;
      izmax_semiblock_up2 = 0;
      has_hi = &is_semiblock_max_z;
      imax = &izmax_semiblock;
      imax_up2 = &izmax_semiblock_up2;
      iVar12 = sweeper.dims_b.ncell_z;
      Sweeper_get_semiblock_bounds
                (&is_semiblock_min_z,has_hi,&izmin_semiblock,imax,imax_up2,sweeper.dims_b.ncell_z,2,
                 dir,(int)local_170,iVar55);
      iVar53 = (int)imax_up2;
      iVar50 = (int)has_hi;
      if (local_b0 == (P *)0x0) {
        __assert_fail("v",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0xc3,
                      "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.ncell_x < 1) {
        __assert_fail("ix >= 0 && ix < dims.ncell_x",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0xc5,
                      "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.ncell_y < 1) {
        __assert_fail("iy >= 0 && iy < dims.ncell_y",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0xc6,
                      "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      iVar45 = sweeper.dims_b.ncell_z * iVar11;
      if ((iVar45 < 0) || (sweeper.dims.ncell_z <= iVar45)) {
        __assert_fail("iz >= 0 && iz < dims.ncell_z",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,199,
                      "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.ne < 1) {
        __assert_fail("ie >= 0 && ie < dims.ne",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,200,
                      "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.nm < 1) {
        __assert_fail("im >= 0 && im < dims.nm",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0xc9,
                      "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      dims.ncell_y = sweeper.dims.ncell_y;
      dims.ncell_x = sweeper.dims.ncell_x;
      dims.ncell_z = sweeper.dims.ncell_z;
      dims.ne = sweeper.dims.ne;
      dims.nm = sweeper.dims.nm;
      dims.na = sweeper.dims.na;
      sVar31 = ind_state(dims,iVar45,iVar50,iy,(int)imax,iVar53,iVar12,iVar55);
      if (local_b8 == (P *)0x0) {
        __assert_fail("v",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x89,
                      "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.ncell_x < 1) {
        __assert_fail("ix >= 0 && ix < dims.ncell_x",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x8b,
                      "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.ncell_y < 1) {
        __assert_fail("iy >= 0 && iy < dims.ncell_y",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x8c,
                      "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.ncell_z <= iVar45) {
        __assert_fail("iz >= 0 && iz < dims.ncell_z",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x8d,
                      "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.ne < 1) {
        __assert_fail("ie >= 0 && ie < dims.ne",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x8e,
                      "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      if (sweeper.dims.nm < 1) {
        __assert_fail("im >= 0 && im < dims.nm",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                      ,0x8f,
                      "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                     );
      }
      iy_00 = uVar1 & 2;
      uVar37 = uVar1 & 4;
      local_38 = local_b0 + sVar31;
      dims_00.ncell_y = sweeper.dims.ncell_y;
      dims_00.ncell_x = sweeper.dims.ncell_x;
      dims_00.ncell_z = sweeper.dims.ncell_z;
      dims_00.ne = sweeper.dims.ne;
      dims_00.nm = sweeper.dims.nm;
      dims_00.na = sweeper.dims.na;
      iVar27 = sweeper.dims.ncell_x;
      iVar28 = sweeper.dims.ncell_y;
      iVar29 = sweeper.dims.ncell_z;
      iVar30 = sweeper.dims.ne;
      iVar57 = sweeper.dims.nm;
      iVar58 = sweeper.dims.na;
      sVar31 = ind_state(dims_00,iVar45,iVar50,iy_00,(int)local_b0,iVar53,iVar12,iVar55);
      iVar55 = ixmin_semiblock;
      iVar45 = ixmax_semiblock_up2;
      iVar53 = iymax_semiblock_up2;
      iVar50 = izmax_semiblock_up2;
      pPVar7 = sweeper.vilocal_host_;
      local_40 = 1L << ((char)local_50 + (char)uVar67 & 0x3fU) & do_block_init;
      local_c0 = (ulong)(uint)ixmin_semiblock;
      local_148 = (ulong)(uint)iymin_semiblock;
      local_150 = (ulong)(uint)izmin_semiblock;
      iVar11 = iVar11 * sweeper.dims_b.ncell_z;
      Sweeper_thread_octant(&sweeper);
      Sweeper_thread_y(&sweeper);
      Sweeper_thread_z(&sweeper);
      Sweeper_thread_e(&sweeper);
      pPVar8 = sweeper.vslocal_host_;
      Sweeper_thread_octant(&sweeper);
      Sweeper_thread_y(&sweeper);
      Sweeper_thread_z(&sweeper);
      Sweeper_thread_e(&sweeper);
      v = sweeper.volocal_host_;
      Sweeper_thread_octant(&sweeper);
      Sweeper_thread_y(&sweeper);
      Sweeper_thread_z(&sweeper);
      Sweeper_thread_e(&sweeper);
      i = iceil((iVar45 - iVar55) + 1,sweeper.ncell_x_per_subblock);
      i_00 = iceil((iVar53 - (int)local_148) + 1,sweeper.ncell_y_per_subblock);
      i_01 = iceil((iVar50 - (int)local_150) + 1,sweeper.ncell_z_per_subblock);
      iVar12 = sweeper.nthread_z;
      iVar55 = sweeper.nthread_y;
      uVar33 = (ulong)(uint)sweeper.nthread_y;
      local_158 = (ulong)(uint)sweeper.nthread_z;
      iceil(i,i);
      j = iceil(i_00,iVar55);
      iVar12 = iceil(i_01,iVar12);
      local_fc = iceil((int)local_158,j);
      if (local_fc < iVar55) {
        local_fc = iVar55;
      }
      if (local_fc < i) {
        local_fc = i;
      }
      local_f8 = iVar12 * j;
      local_60 = (ulong)(uint)(local_fc * local_f8);
      local_100 = iVar55 + -1;
      if (iy_00 == 0) {
        local_100 = 0;
      }
      local_104 = (int)local_158 + -1;
      local_118 = local_b8 + sVar31;
      if (uVar37 == 0) {
        local_104 = 0;
      }
      uVar42 = (local_fc * local_f8 - 2U) + (int)local_158 + iVar55;
      local_108 = (int)local_c0 + -1;
      local_10c = (int)local_148 + -1;
      local_110 = (int)local_150 + -1;
      dVar69 = (double)(int)(uVar1 + 1);
      uVar38 = uVar1 * 0x10;
      uVar63 = 0;
      local_78 = (ulong)(-(uint)(uVar49 == 0) | 1);
      local_80 = (ulong)((uint)(iy_00 != 0) * 2 - 1);
      local_88 = (ulong)(-(uint)(uVar1 < 4) | 1);
      local_168 = 1.0 / dVar69;
      if ((int)uVar42 < 1) {
        uVar42 = uVar63;
      }
      local_68 = pPVar7 + 0x20;
      local_70 = pPVar8 + 3;
      local_58 = uVar33;
      for (; uVar63 != uVar42; uVar63 = uVar63 + 1) {
        Sweeper_thread_y(&sweeper);
        Sweeper_thread_z(&sweeper);
        uVar13 = ~uVar63 + (int)local_60;
        if (uVar49 == 0) {
          uVar13 = uVar63;
        }
        iVar55 = (int)uVar13 % local_fc;
        uVar14 = (int)uVar63 / local_fc;
        uVar13 = ~uVar14 + local_f8;
        if (uVar37 == 0) {
          uVar13 = uVar14;
        }
        uVar40 = ~uVar14 + local_f8;
        if (iy_00 == 0) {
          uVar40 = uVar14;
        }
        iVar64 = ((int)uVar40 % j) * (int)local_58 + local_100;
        iVar12 = ((int)uVar13 / j) * (int)local_158 + local_104;
        bVar3 = false;
        if ((((((int)uVar63 < (int)local_60) && (-1 < iVar12)) && (iVar12 < i_01)) &&
            ((-1 < iVar64 && (-1 < iVar55)))) && (iVar64 < i_00)) {
          bVar3 = iVar55 < i;
        }
        iVar51 = sweeper.ncell_x_per_subblock * iVar55 + (int)local_c0;
        iVar56 = (iVar55 + 1) * sweeper.ncell_x_per_subblock + local_108;
        iVar15 = sweeper.ncell_y_per_subblock * iVar64 + (int)local_148;
        iVar65 = (iVar64 + 1) * sweeper.ncell_y_per_subblock + local_10c;
        iVar64 = sweeper.ncell_z_per_subblock * iVar12 + (int)local_150;
        iVar46 = (iVar12 + 1) * sweeper.ncell_z_per_subblock + local_110;
        Sweeper_thread_e(&sweeper);
        iVar12 = sweeper.dims.ne;
        Sweeper_thread_e(&sweeper);
        iVar12 = iVar12 / sweeper.nthread_e;
        iVar55 = iVar56;
        if (uVar49 != 0) {
          iVar55 = iVar51;
          iVar51 = iVar56;
        }
        iVar56 = iVar65;
        if (iy_00 != 0) {
          iVar56 = iVar15;
          iVar15 = iVar65;
        }
        iVar65 = iVar46;
        if (uVar37 != 0) {
          iVar65 = iVar64;
          iVar64 = iVar46;
        }
        iVar46 = 0;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        local_160 = (ulong)(uint)quan.ix_base;
        local_a0 = (ulong)(uint)quan.iy_base;
        local_90 = uVar62;
        for (; uVar13 = (uint)uVar67, iVar54 = iVar64, iVar46 != iVar12; iVar46 = iVar46 + 1) {
          for (; iVar54 != iVar65 + dir; iVar54 = iVar54 + dir) {
            iVar16 = iVar11 + iVar54;
            iVar17 = iVar16 - dir;
            for (iVar39 = iVar15; iVar39 != iVar56 + dir_01; iVar39 = iVar39 + dir_01) {
              iVar18 = (int)local_a0 + iVar39;
              iVar19 = iVar18 - dir_01;
              for (iVar20 = iVar51; iVar20 != iVar55 + dir_00; iVar20 = iVar20 + dir_00) {
                if (((iVar20 < sweeper.dims_b.ncell_x) && (iVar39 < sweeper.dims_b.ncell_y)) &&
                   (((iVar20 <= iVar45 && iVar39 <= iVar53) && iVar54 < sweeper.dims_b.ncell_z) &&
                    ((iVar2 != 0 && bVar3) && iVar54 <= iVar50))) {
                  if ((iVar16 == 0 && uVar37 == 0) ||
                     ((uVar37 != 0 && (iVar16 == sweeper.dims_g.ncell_z + -1)))) {
                    iVar47 = (int)local_160 + iVar20;
                    iVar22 = 0;
                    iVar21 = sweeper.dims_b.na;
                    if (sweeper.dims_b.na < 1) {
                      iVar21 = 0;
                    }
                    while (iVar61 = iVar22, iVar61 != 4) {
                      iVar60 = iVar21;
                      iVar26 = 0;
                      while (iVar25 = sweeper.dims_g.ne, iVar66 = sweeper.dims_g.ncell_z,
                            iVar9 = sweeper.dims_g.ncell_y, iVar24 = sweeper.dims_g.ncell_x,
                            bVar68 = iVar60 != 0, iVar60 = iVar60 + -1, iVar22 = iVar61 + 1, bVar68)
                      {
                        if ((iVar47 < 0) || (sweeper.dims_g.ncell_x <= iVar47)) {
                          __assert_fail("ix_g >= 0 && ix_g < dims_g.ncell_x",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0xe6,
                                        "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if ((iVar18 < 0) || (sweeper.dims_g.ncell_y <= iVar18)) {
                          __assert_fail("iy_g >= 0 && iy_g < dims_g.ncell_y",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0xe7,
                                        "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if ((iVar17 != -1 || uVar37 != 0) &&
                           ((uVar37 == 0 || (sweeper.dims_g.ncell_z != iVar17)))) {
                          __assert_fail("( iz_g == -1 && Dir_z(octant)==DIR_UP ) || ( iz_g == dims_g.ncell_z && Dir_z(octant)==DIR_DN )"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0xe9,
                                        "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if (sweeper.dims_g.ne <= iVar46) {
                          __assert_fail("ie >= 0 && ie < dims_g.ne",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0xea,
                                        "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        iStack_2a4 = sweeper.dims_g.na;
                        if (iStack_2a4 <= iVar26) {
                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0xeb,
                                        "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if (7 < uVar1) {
                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0xed,
                                        "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        iVar27 = sweeper.dims_g.nm;
                        dims_01.ncell_y = sweeper.dims_g.ncell_y;
                        dims_01.ncell_x = sweeper.dims_g.ncell_x;
                        dims_01.ncell_z = sweeper.dims_g.ncell_z;
                        dims_01.ne = sweeper.dims_g.ne;
                        dims_01.nm = iVar27;
                        dims_01.na = iStack_2a4;
                        iVar22 = Quantities_scalefactor_angle_(dims_01,iVar26);
                        iVar23 = Quantities_scalefactor_space_(&quan,iVar47,iVar18,iVar17);
                        dims_02.ncell_y = iVar9;
                        dims_02.ncell_x = iVar24;
                        dims_02.ncell_z = iVar66;
                        dims_02.ne = iVar25;
                        dims_02.nm = iVar27;
                        dims_02.na = iStack_2a4;
                        iVar24 = Quantities_scalefactor_energy_(iVar46,dims_02);
                        dims_03.ncell_y = sweeper.dims_b.ncell_y;
                        dims_03.ncell_x = sweeper.dims_b.ncell_x;
                        dims_03.ncell_z = sweeper.dims_b.ncell_z;
                        dims_03.ne = sweeper.dims_b.ne;
                        dims_03.nm = sweeper.dims_b.nm;
                        dims_03.na = sweeper.dims_b.na;
                        iVar27 = sweeper.dims_b.ncell_x;
                        iVar28 = sweeper.dims_b.ncell_y;
                        iVar29 = sweeper.dims_b.ncell_z;
                        iVar30 = sweeper.dims_b.ne;
                        iVar57 = sweeper.dims_b.nm;
                        iVar58 = sweeper.dims_b.na;
                        in_stack_fffffffffffffca8 = uVar13;
                        pPVar32 = ref_facexy(facexy,dims_03,sweeper.noctant_per_block,iVar20,iVar39,
                                             iVar46,iVar26,iVar61,uVar13,in_stack_fffffffffffffcb0);
                        *pPVar32 = (double)iVar24 *
                                   (double)iVar23 * (double)iVar22 * (double)(iVar26 + 1) *
                                   (double)(1 << ((byte)(iVar61 + 1) & 3)) * dVar69;
                        iVar26 = iVar26 + 1;
                      }
                    }
                  }
                  local_34c = (int)local_160;
                  if ((iVar18 == 0 && iy_00 == 0) ||
                     ((iy_00 != 0 && (iVar18 == sweeper.dims_g.ncell_y + -1)))) {
                    iVar47 = local_34c + iVar20;
                    iVar22 = 0;
                    iVar21 = sweeper.dims_b.na;
                    if (sweeper.dims_b.na < 1) {
                      iVar21 = 0;
                    }
                    while (iVar61 = iVar22, iVar61 != 4) {
                      iVar60 = iVar21;
                      iVar26 = 0;
                      while (iVar25 = sweeper.dims_g.ne, iVar66 = sweeper.dims_g.ncell_z,
                            iVar9 = sweeper.dims_g.ncell_y, iVar24 = sweeper.dims_g.ncell_x,
                            bVar68 = iVar60 != 0, iVar60 = iVar60 + -1, iVar22 = iVar61 + 1, bVar68)
                      {
                        if ((iVar47 < 0) || (sweeper.dims_g.ncell_x <= iVar47)) {
                          __assert_fail("ix_g >= 0 && ix_g < dims_g.ncell_x",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x110,
                                        "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if ((iVar19 != -1 || iy_00 != 0) &&
                           ((iy_00 == 0 || (sweeper.dims_g.ncell_y != iVar19)))) {
                          __assert_fail("( iy_g == -1 && Dir_y(octant)==DIR_UP ) || ( iy_g == dims_g.ncell_y && Dir_y(octant)==DIR_DN )"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x112,
                                        "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if ((iVar16 < 0) || (sweeper.dims_g.ncell_z <= iVar16)) {
                          __assert_fail("iz_g >= 0 && iz_g < dims_g.ncell_z",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x113,
                                        "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if (sweeper.dims_g.ne <= iVar46) {
                          __assert_fail("ie >= 0 && ie < dims_g.ne",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x114,
                                        "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        iStack_2a4 = sweeper.dims_g.na;
                        if (iStack_2a4 <= iVar26) {
                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x115,
                                        "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if (7 < uVar1) {
                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x117,
                                        "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        iVar27 = sweeper.dims_g.nm;
                        dims_04.ncell_y = sweeper.dims_g.ncell_y;
                        dims_04.ncell_x = sweeper.dims_g.ncell_x;
                        dims_04.ncell_z = sweeper.dims_g.ncell_z;
                        dims_04.ne = sweeper.dims_g.ne;
                        dims_04.nm = iVar27;
                        dims_04.na = iStack_2a4;
                        iVar22 = Quantities_scalefactor_angle_(dims_04,iVar26);
                        iVar23 = Quantities_scalefactor_space_(&quan,iVar47,iVar19,iVar16);
                        dims_05.ncell_y = iVar9;
                        dims_05.ncell_x = iVar24;
                        dims_05.ncell_z = iVar66;
                        dims_05.ne = iVar25;
                        dims_05.nm = iVar27;
                        dims_05.na = iStack_2a4;
                        iVar24 = Quantities_scalefactor_energy_(iVar46,dims_05);
                        dims_06.ncell_y = sweeper.dims_b.ncell_y;
                        dims_06.ncell_x = sweeper.dims_b.ncell_x;
                        dims_06.ncell_z = sweeper.dims_b.ncell_z;
                        dims_06.ne = sweeper.dims_b.ne;
                        dims_06.nm = sweeper.dims_b.nm;
                        dims_06.na = sweeper.dims_b.na;
                        iVar27 = sweeper.dims_b.ncell_x;
                        iVar28 = sweeper.dims_b.ncell_y;
                        iVar29 = sweeper.dims_b.ncell_z;
                        iVar30 = sweeper.dims_b.ne;
                        iVar57 = sweeper.dims_b.nm;
                        iVar58 = sweeper.dims_b.na;
                        in_stack_fffffffffffffca8 = uVar13;
                        pPVar32 = ref_facexz(facexz,dims_06,sweeper.noctant_per_block,iVar20,iVar54,
                                             iVar46,iVar26,iVar61,uVar13,in_stack_fffffffffffffcb0);
                        *pPVar32 = (double)iVar24 *
                                   (double)iVar23 * (double)iVar22 * (double)(iVar26 + 1) *
                                   (double)(1 << ((byte)(iVar61 + 1) & 3)) * dVar69;
                        iVar26 = iVar26 + 1;
                      }
                    }
                  }
                  local_34c = local_34c + iVar20;
                  if ((local_34c == 0 && uVar49 == 0) ||
                     ((uVar49 != 0 && (local_34c == sweeper.dims_g.ncell_x + -1)))) {
                    local_34c = local_34c - dir_00;
                    iVar22 = 0;
                    iVar21 = sweeper.dims_b.na;
                    if (sweeper.dims_b.na < 1) {
                      iVar21 = 0;
                    }
                    while (iVar47 = iVar22, iVar47 != 4) {
                      iVar61 = iVar21;
                      iVar60 = 0;
                      while (iVar66 = sweeper.dims_g.ne, iVar9 = sweeper.dims_g.ncell_z,
                            iVar24 = sweeper.dims_g.ncell_y, iVar26 = sweeper.dims_g.ncell_x,
                            bVar68 = iVar61 != 0, iVar61 = iVar61 + -1, iVar22 = iVar47 + 1, bVar68)
                      {
                        if ((local_34c != -1 || uVar49 != 0) &&
                           ((uVar49 == 0 || (sweeper.dims_g.ncell_x != local_34c)))) {
                          __assert_fail("( ix_g == -1 && Dir_x(octant)==DIR_UP ) || ( ix_g == dims_g.ncell_x && Dir_x(octant)==DIR_DN )"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x137,
                                        "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if ((iVar18 < 0) || (sweeper.dims_g.ncell_y <= iVar18)) {
                          __assert_fail("iy_g >= 0 && iy_g < dims_g.ncell_y",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x138,
                                        "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if ((iVar16 < 0) || (sweeper.dims_g.ncell_z <= iVar16)) {
                          __assert_fail("iz_g >= 0 && iz_g < dims_g.ncell_z",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x139,
                                        "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if (sweeper.dims_g.ne <= iVar46) {
                          __assert_fail("ie >= 0 && ie < dims_g.ne",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x13a,
                                        "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        iStack_2a4 = sweeper.dims_g.na;
                        if (iStack_2a4 <= iVar60) {
                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x13b,
                                        "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        if (7 < uVar1) {
                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                        ,0x13d,
                                        "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                       );
                        }
                        iVar27 = sweeper.dims_g.nm;
                        dims_07.ncell_y = sweeper.dims_g.ncell_y;
                        dims_07.ncell_x = sweeper.dims_g.ncell_x;
                        dims_07.ncell_z = sweeper.dims_g.ncell_z;
                        dims_07.ne = sweeper.dims_g.ne;
                        dims_07.nm = iVar27;
                        dims_07.na = iStack_2a4;
                        iVar22 = Quantities_scalefactor_angle_(dims_07,iVar60);
                        iVar25 = Quantities_scalefactor_space_(&quan,local_34c,iVar18,iVar16);
                        dims_08.ncell_y = iVar24;
                        dims_08.ncell_x = iVar26;
                        dims_08.ncell_z = iVar9;
                        dims_08.ne = iVar66;
                        dims_08.nm = iVar27;
                        dims_08.na = iStack_2a4;
                        iVar26 = Quantities_scalefactor_energy_(iVar46,dims_08);
                        dims_09.ncell_y = sweeper.dims_b.ncell_y;
                        dims_09.ncell_x = sweeper.dims_b.ncell_x;
                        dims_09.ncell_z = sweeper.dims_b.ncell_z;
                        dims_09.ne = sweeper.dims_b.ne;
                        dims_09.nm = sweeper.dims_b.nm;
                        dims_09.na = sweeper.dims_b.na;
                        iVar27 = sweeper.dims_b.ncell_x;
                        iVar28 = sweeper.dims_b.ncell_y;
                        iVar29 = sweeper.dims_b.ncell_z;
                        iVar30 = sweeper.dims_b.ne;
                        iVar57 = sweeper.dims_b.nm;
                        iVar58 = sweeper.dims_b.na;
                        in_stack_fffffffffffffca8 = uVar13;
                        pPVar32 = ref_faceyz(faceyz,dims_09,sweeper.noctant_per_block,iVar39,iVar54,
                                             iVar46,iVar60,iVar47,uVar13,in_stack_fffffffffffffcb0);
                        *pPVar32 = (double)iVar26 *
                                   (double)iVar25 * (double)iVar22 * (double)(iVar60 + 1) *
                                   (double)(1 << ((byte)(iVar47 + 1) & 3)) * dVar69;
                        iVar60 = iVar60 + 1;
                      }
                    }
                  }
                }
                uVar62 = local_90;
              }
            }
          }
        }
        for (iVar46 = 0; iVar54 = iVar64, iVar46 != iVar12; iVar46 = iVar46 + 1) {
          for (; iVar54 != iVar65 + dir; iVar54 = iVar54 + dir) {
            uVar14 = iVar54 + iVar11;
            local_140 = (ulong)uVar14;
            local_f0 = (int)local_88 + uVar14;
            for (iVar39 = iVar15; iVar39 != iVar56 + dir_01; iVar39 = iVar39 + dir_01) {
              uVar14 = iVar39 + (int)local_a0;
              local_130 = (ulong)uVar14;
              local_ec = (int)local_80 + uVar14;
              for (iVar16 = iVar51; iVar20 = sweeper.dims_b.na, iVar17 = sweeper.dims_b.ncell_x,
                  iVar16 != iVar55 + dir_00; iVar16 = iVar16 + dir_00) {
                bVar68 = false;
                if ((iVar16 < sweeper.dims_b.ncell_x) && (iVar39 < sweeper.dims_b.ncell_y)) {
                  bVar68 = (bool)(iVar39 <= iVar53 & iVar2 != 0 & bVar3 & iVar54 <= iVar50 &
                                 (iVar16 <= iVar45 && iVar54 < sweeper.dims_b.ncell_z));
                }
                bVar4 = sweeper.dims_b.ncell_x <= iVar16;
                lVar52 = (long)sweeper.dims_b.na;
                uVar14 = iVar16 + (int)local_160;
                local_138 = (ulong)uVar14;
                local_e8 = (int)local_78 + uVar14;
                local_1a0 = uVar38 * sweeper.dims_b.na;
                uVar62 = 0;
                local_238 = faceyz;
                local_230 = facexy;
                local_228 = facexz;
                while ((long)uVar62 < lVar52) {
                  pPVar32 = local_68;
                  for (lVar59 = 0; iVar22 = sweeper.dims_b.ne, iVar19 = sweeper.dims_b.ncell_z,
                      iVar18 = sweeper.dims_b.ncell_y, lVar59 != 2; lVar59 = lVar59 + 1) {
                    local_310 = (uint)lVar59 | 2;
                    bVar5 = sweeper.dims_b.ncell_z <= iVar54;
                    bVar6 = sweeper.dims_b.ncell_y <= iVar39;
                    for (lVar48 = 0; lVar48 != 0x10; lVar48 = lVar48 + 1) {
                      if ((bool)(uVar62 == 0 & bVar68)) {
                        if (iVar16 < 0 || bVar4) {
                          __assert_fail("ix >= 0 && ix < dims_ncell_x",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0xa9,
                                        "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                       );
                        }
                        if (bVar6 || iVar39 < 0) {
                          __assert_fail("iy >= 0 && iy < dims_ncell_y",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0xaa,
                                        "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                       );
                        }
                        if (bVar5 || iVar54 < 0) {
                          __assert_fail("iz >= 0 && iz < dims_ncell_z",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0xab,
                                        "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                       );
                        }
                        if (iVar22 <= iVar46) {
                          __assert_fail("ie >= 0 && ie < dims_ne",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0xac,
                                        "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                       );
                        }
                        iVar57 = (int)lVar48;
                        sVar31 = ind_state_flat(iVar17,iVar18,iVar19,iVar22,iVar16,iVar39,iVar54,
                                                iVar46,iVar57,(uint)lVar59,in_stack_fffffffffffffca8
                                                ,in_stack_fffffffffffffcb0);
                        pPVar35 = local_38;
                        if (pPVar7 == (P *)0x0) {
                          __assert_fail("v",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0xda,
                                        "P *ref_vilocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                       );
                        }
                        pPVar32[lVar48 + -0x20] = local_38[sVar31];
                        iVar27 = iVar54;
                        iVar29 = iVar46;
                        sVar31 = ind_state_flat(iVar17,iVar18,iVar19,iVar22,iVar16,iVar39,iVar54,
                                                iVar46,iVar57,local_310,in_stack_fffffffffffffca8,
                                                in_stack_fffffffffffffcb0);
                        pPVar32[lVar48] = pPVar35[sVar31];
                      }
                    }
                    pPVar32 = pPVar32 + 0x10;
                  }
                  for (uVar33 = 0; uVar33 != 0x20; uVar33 = uVar33 + 1) {
                    if ((int)(uVar33 | uVar62) < iVar20 && bVar68) {
                      dVar71 = 0.0;
                      dVar78 = 0.0;
                      dVar70 = 0.0;
                      dVar72 = 0.0;
                      for (lVar59 = 0; lVar59 != 0x10; lVar59 = lVar59 + 1) {
                        if (local_98 == (P *)0x0) {
                          __assert_fail("v",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0x180,
                                        "const P *restrict const_ref_a_from_m_flat(const P *const restrict, const int, const int, const int, const int, const int)"
                                       );
                        }
                        if (7 < uVar1) {
                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0x183,
                                        "const P *restrict const_ref_a_from_m_flat(const P *const restrict, const int, const int, const int, const int, const int)"
                                       );
                        }
                        if (pPVar7 == (P *)0x0) {
                          __assert_fail("v",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                        ,0xef,
                                        "const P *const_ref_vilocal(const P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                       );
                        }
                        dVar79 = local_98[(uVar33 | uVar62) +
                                          (ulong)((uVar38 | (uint)lVar59) * iVar20)];
                        dVar70 = dVar70 + pPVar7[lVar59 + 0x10] * dVar79;
                        dVar72 = dVar72 + pPVar7[lVar59] * dVar79;
                        dVar71 = dVar71 + pPVar7[lVar59 + 0x30] * dVar79;
                        dVar78 = dVar78 + pPVar7[lVar59 + 0x20] * dVar79;
                      }
                      pPVar8[uVar33] = dVar72;
                      pPVar8[uVar33 + 0x20] = dVar70;
                      pPVar8[uVar33 + 0x40] = dVar78;
                      pPVar8[uVar33 + 0x60] = dVar71;
                    }
                  }
                  lVar59 = (long)sweeper.noctant_per_block;
                  local_a8 = lVar59;
                  for (lVar48 = 0; uVar10 = sweeper.dims_g._16_8_, iVar9 = sweeper.dims_g.ne,
                      iVar24 = sweeper.dims_g.ncell_z, iVar26 = sweeper.dims_g.ncell_y,
                      iVar60 = sweeper.dims_g.ncell_x, iVar61 = sweeper.dims_b.na,
                      iVar47 = sweeper.dims_b.nm, iVar21 = sweeper.dims_b.ne,
                      iVar22 = sweeper.dims_b.ncell_z, iVar19 = sweeper.dims_b.ncell_y,
                      iVar18 = sweeper.dims_b.ncell_x, lVar48 != 0x20; lVar48 = lVar48 + 1) {
                    if (pPVar8 == (P *)0x0) {
                      __assert_fail("vslocal",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                    ,0x168,
                                    "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                   );
                    }
                    if (facexy == (P *)0x0) {
                      __assert_fail("facexy",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                    ,0x16f,
                                    "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                   );
                    }
                    if (facexz == (P *)0x0) {
                      __assert_fail("facexz",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                    ,0x170,
                                    "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                   );
                    }
                    if (faceyz == (P *)0x0) {
                      __assert_fail("faceyz",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                    ,0x171,
                                    "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                   );
                    }
                    if (iVar16 < 0) {
                      if (bVar68) goto LAB_00108953;
                    }
                    else {
                      if ((bVar68) && (sweeper.dims_b.ncell_x <= iVar16)) {
LAB_00108953:
                        __assert_fail("( ix_b >= 0 && ix_b < dims_b.ncell_x ) || ! is_cell_active",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                      ,0x172,
                                      "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                     );
                      }
                      if (iVar39 < 0) {
                        if (bVar68) goto LAB_001089cf;
                      }
                      else if ((bVar68) && (sweeper.dims_b.ncell_y <= iVar39)) {
LAB_001089cf:
                        __assert_fail("( iy_b >= 0 && iy_b < dims_b.ncell_y ) || ! is_cell_active",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                      ,0x173,
                                      "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                     );
                      }
                    }
                    iVar66 = (int)local_138;
                    if (iVar54 < 0) {
                      if (bVar68) goto LAB_00108972;
                    }
                    else {
                      if ((bVar68) && (sweeper.dims_b.ncell_z <= iVar54)) {
LAB_00108972:
                        __assert_fail("( iz_b >= 0 && iz_b < dims_b.ncell_z ) || ! is_cell_active",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                      ,0x174,
                                      "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                     );
                      }
                      if ((int)local_138 < 0) {
                        if (bVar68) goto LAB_001089ee;
                      }
                      else if ((bVar68) && (sweeper.dims_g.ncell_x <= (int)local_138)) {
LAB_001089ee:
                        __assert_fail("( ix_g >= 0 && ix_g < dims_g.ncell_x ) || ! is_cell_active",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                      ,0x175,
                                      "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                     );
                      }
                    }
                    iVar23 = (int)local_130;
                    iVar25 = (int)local_140;
                    if ((int)local_130 < 0) {
                      if (bVar68) goto LAB_00108915;
                    }
                    else {
                      if ((bVar68) && (sweeper.dims_g.ncell_y <= (int)local_130)) {
LAB_00108915:
                        __assert_fail("( iy_g >= 0 && iy_g < dims_g.ncell_y ) || ! is_cell_active",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                      ,0x176,
                                      "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                     );
                      }
                      if ((int)local_140 < 0) {
                        if (bVar68) goto LAB_001089b0;
                      }
                      else if ((bVar68) && (sweeper.dims_g.ncell_z <= (int)local_140)) {
LAB_001089b0:
                        __assert_fail("( iz_g >= 0 && iz_g < dims_g.ncell_z ) || ! is_cell_active",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                      ,0x177,
                                      "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                     );
                      }
                    }
                    if (sweeper.dims_b.ne <= iVar46) {
                      __assert_fail("ie >= 0 && ie < dims_b.ne",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                    ,0x178,
                                    "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                   );
                    }
                    if (7 < uVar1) {
                      __assert_fail("octant >= 0 && octant < NOCTANT",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                    ,0x179,
                                    "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                   );
                    }
                    if (lVar59 <= (long)uVar67) {
                      __assert_fail("octant_in_block >= 0 && octant_in_block < noctant_per_block",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                    ,0x17a,
                                    "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                   );
                    }
                    ia = (int)(lVar48 + uVar62);
                    if (ia < sweeper.dims_b.na && bVar68) {
                      iVar27 = Quantities_scalefactor_space_
                                         (&quan,(int)local_138,(int)local_130,(int)local_140);
                      iVar28 = Quantities_scalefactor_space_(&quan,local_e8,iVar23,iVar25);
                      iVar29 = Quantities_scalefactor_space_(&quan,iVar66,local_ec,iVar25);
                      iVar30 = Quantities_scalefactor_space_(&quan,iVar66,iVar23,local_f0);
                      if ((iVar16 < 0) || (iVar18 <= iVar16)) {
                        __assert_fail("ix >= 0 && ix < dims.ncell_x",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                      ,0x1fa,
                                      "const P *const_ref_facexy(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                     );
                      }
                      if ((iVar39 < 0) || (iVar19 <= iVar39)) {
                        __assert_fail("iy >= 0 && iy < dims.ncell_y",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                      ,0x1fb,
                                      "const P *const_ref_facexy(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                     );
                      }
                      iStack_2a4 = SUB84(uVar10,4);
                      if (iStack_2a4 <= ia) {
                        __assert_fail("ia >= 0 && ia < dims.na",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                      ,0x96,"P Quantities_xfluxweight_(Dimensions, int)");
                      }
                      if (iVar54 < 0 || iVar22 <= iVar54) {
                        __assert_fail("iz >= 0 && iz < dims.ncell_z",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                      ,0x23b,
                                      "const P *const_ref_facexz(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                     );
                      }
                      dVar72 = (double)iVar27;
                      iVar27 = iVar61 * 4;
                      iVar66 = iVar21 * uVar13 + iVar46;
                      iVar57 = iVar22 * iVar66 + iVar54;
                      iVar58 = iVar57 * iVar19 + iVar39;
                      dVar71 = local_238[(ulong)(uint)(iVar27 * iVar58) + lVar48];
                      iVar66 = (iVar19 * iVar66 + iVar39) * iVar18 + iVar16;
                      iVar57 = iVar18 * iVar57 + iVar16;
                      dVar76 = 1.0 / dVar72;
                      dVar77 = 1.0 / (double)iVar28;
                      local_120 = 1.0 / (double)iVar29;
                      local_128 = 1.0 / (double)iVar30;
                      dVar78 = pPVar8[lVar48];
                      dVar70 = local_228[(ulong)(uint)(iVar27 * iVar57) + lVar48] * 0.25 * local_120
                      ;
                      dVar79 = local_230[(ulong)(uint)(iVar27 * iVar66) + lVar48] * 0.5 * local_128;
                      iVar29 = (int)uVar10;
                      dims_10.ncell_y = iVar26;
                      dims_10.ncell_x = iVar60;
                      dims_10.ncell_z = iVar24;
                      dims_10.ne = iVar9;
                      dims_10.nm = iVar29;
                      dims_10.na = iStack_2a4;
                      iVar27 = Quantities_scalefactor_angle_(dims_10,ia);
                      dVar71 = (dVar78 * dVar76 +
                               ((0.25 - 1.0 / (double)iVar27) * dVar71 * dVar77 + dVar79 + dVar70) *
                               local_168) * dVar72;
                      pPVar8[lVar48] = dVar71;
                      dVar71 = dVar71 * dVar69;
                      iVar27 = (int)local_a8;
                      dims_11.ncell_y = iVar19;
                      dims_11.ncell_x = iVar18;
                      dims_11.ncell_z = iVar22;
                      dims_11.ne = iVar21;
                      dims_11.nm = iVar47;
                      dims_11.na = iVar61;
                      pPVar32 = ref_facexy(facexy,dims_11,iVar27,iVar16,iVar39,iVar46,ia,0,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dims_12.ncell_y = iVar19;
                      dims_12.ncell_x = iVar18;
                      dims_12.ncell_z = iVar22;
                      dims_12.ne = iVar21;
                      dims_12.nm = iVar47;
                      dims_12.na = iVar61;
                      pPVar32 = ref_facexz(facexz,dims_12,iVar27,iVar16,iVar54,iVar46,ia,0,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dims_13.ncell_y = iVar19;
                      dims_13.ncell_x = iVar18;
                      dims_13.ncell_z = iVar22;
                      dims_13.ne = iVar21;
                      dims_13.nm = iVar47;
                      dims_13.na = iVar61;
                      pPVar32 = ref_faceyz(faceyz,dims_13,iVar27,iVar39,iVar54,iVar46,ia,0,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      uVar14 = iVar66 * 4;
                      uVar40 = iVar57 * 4;
                      uVar43 = iVar58 * 4;
                      dVar71 = local_238[(ulong)((uVar43 | 1) * iVar61) + lVar48];
                      dVar70 = local_228[(ulong)((uVar40 | 1) * iVar61) + lVar48] * 0.25 * local_120
                      ;
                      dVar79 = local_230[(ulong)((uVar14 | 1) * iVar61) + lVar48] * 0.5 * local_128;
                      dVar78 = pPVar8[lVar48 + 0x20];
                      dims_14.ncell_y = iVar26;
                      dims_14.ncell_x = iVar60;
                      dims_14.ncell_z = iVar24;
                      dims_14.ne = iVar9;
                      dims_14.nm = iVar29;
                      dims_14.na = iStack_2a4;
                      iVar27 = Quantities_scalefactor_angle_(dims_14,ia);
                      lVar59 = local_a8;
                      dVar71 = (((0.25 - 1.0 / (double)iVar27) * dVar71 * dVar77 + dVar79 + dVar70)
                                * local_168 + dVar78 * dVar76) * dVar72;
                      pPVar8[lVar48 + 0x20] = dVar71;
                      dVar71 = dVar71 * dVar69;
                      dims_15.ncell_y = iVar19;
                      dims_15.ncell_x = iVar18;
                      dims_15.ncell_z = iVar22;
                      dims_15.ne = iVar21;
                      dims_15.nm = iVar47;
                      dims_15.na = iVar61;
                      iVar28 = (int)local_a8;
                      pPVar32 = ref_facexy(facexy,dims_15,iVar28,iVar16,iVar39,iVar46,ia,1,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dims_16.ncell_y = iVar19;
                      dims_16.ncell_x = iVar18;
                      dims_16.ncell_z = iVar22;
                      dims_16.ne = iVar21;
                      dims_16.nm = iVar47;
                      dims_16.na = iVar61;
                      pPVar32 = ref_facexz(facexz,dims_16,iVar28,iVar16,iVar54,iVar46,ia,1,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dims_17.ncell_y = iVar19;
                      dims_17.ncell_x = iVar18;
                      dims_17.ncell_z = iVar22;
                      dims_17.ne = iVar21;
                      dims_17.nm = iVar47;
                      dims_17.na = iVar61;
                      pPVar32 = ref_faceyz(faceyz,dims_17,iVar28,iVar39,iVar54,iVar46,ia,1,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dVar71 = local_238[(ulong)((uVar43 | 2) * iVar61) + lVar48];
                      dVar70 = local_228[(ulong)((uVar40 | 2) * iVar61) + lVar48] * 0.25 * local_120
                      ;
                      dVar79 = local_230[(ulong)((uVar14 | 2) * iVar61) + lVar48] * 0.5 * local_128;
                      dVar78 = pPVar8[lVar48 + 0x40];
                      dims_18.ncell_y = iVar26;
                      dims_18.ncell_x = iVar60;
                      dims_18.ncell_z = iVar24;
                      dims_18.ne = iVar9;
                      dims_18.nm = iVar29;
                      dims_18.na = iStack_2a4;
                      iVar27 = Quantities_scalefactor_angle_(dims_18,ia);
                      dVar71 = (((0.25 - 1.0 / (double)iVar27) * dVar71 * dVar77 + dVar79 + dVar70)
                                * local_168 + dVar78 * dVar76) * dVar72;
                      pPVar8[lVar48 + 0x40] = dVar71;
                      dVar71 = dVar71 * dVar69;
                      dims_19.ncell_y = iVar19;
                      dims_19.ncell_x = iVar18;
                      dims_19.ncell_z = iVar22;
                      dims_19.ne = iVar21;
                      dims_19.nm = iVar47;
                      dims_19.na = iVar61;
                      pPVar32 = ref_facexy(facexy,dims_19,iVar28,iVar16,iVar39,iVar46,ia,2,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dims_20.ncell_y = iVar19;
                      dims_20.ncell_x = iVar18;
                      dims_20.ncell_z = iVar22;
                      dims_20.ne = iVar21;
                      dims_20.nm = iVar47;
                      dims_20.na = iVar61;
                      pPVar32 = ref_facexz(facexz,dims_20,iVar28,iVar16,iVar54,iVar46,ia,2,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dims_21.ncell_y = iVar19;
                      dims_21.ncell_x = iVar18;
                      dims_21.ncell_z = iVar22;
                      dims_21.ne = iVar21;
                      dims_21.nm = iVar47;
                      dims_21.na = iVar61;
                      pPVar32 = ref_faceyz(faceyz,dims_21,iVar28,iVar39,iVar54,iVar46,ia,2,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar71;
                      dVar71 = local_238[(ulong)((uVar43 | 3) * iVar61) + lVar48];
                      dVar70 = local_228[(ulong)((uVar40 | 3) * iVar61) + lVar48] * 0.25 * local_120
                      ;
                      dVar79 = local_230[(ulong)((uVar14 | 3) * iVar61) + lVar48] * 0.5 * local_128;
                      dVar78 = pPVar8[lVar48 + 0x60];
                      dims_22.ncell_y = iVar26;
                      dims_22.ncell_x = iVar60;
                      dims_22.ncell_z = iVar24;
                      dims_22.ne = iVar9;
                      dims_22.nm = iVar29;
                      dims_22.na = iStack_2a4;
                      iVar27 = Quantities_scalefactor_angle_(dims_22,ia);
                      dVar72 = (((0.25 - 1.0 / (double)iVar27) * dVar71 * dVar77 + dVar79 + dVar70)
                                * local_168 + dVar76 * dVar78) * dVar72;
                      pPVar8[lVar48 + 0x60] = dVar72;
                      dVar72 = dVar72 * dVar69;
                      dims_23.ncell_y = iVar19;
                      dims_23.ncell_x = iVar18;
                      dims_23.ncell_z = iVar22;
                      dims_23.ne = iVar21;
                      dims_23.nm = iVar47;
                      dims_23.na = iVar61;
                      pPVar32 = ref_facexy(facexy,dims_23,iVar28,iVar16,iVar39,iVar46,ia,3,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar72;
                      dims_24.ncell_y = iVar19;
                      dims_24.ncell_x = iVar18;
                      dims_24.ncell_z = iVar22;
                      dims_24.ne = iVar21;
                      dims_24.nm = iVar47;
                      dims_24.na = iVar61;
                      pPVar32 = ref_facexz(facexz,dims_24,iVar28,iVar16,iVar54,iVar46,ia,3,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar72;
                      dims_25.ncell_y = iVar19;
                      dims_25.ncell_x = iVar18;
                      dims_25.ncell_z = iVar22;
                      dims_25.ne = iVar21;
                      dims_25.nm = iVar47;
                      dims_25.na = iVar61;
                      in_stack_fffffffffffffca8 = uVar13;
                      pPVar32 = ref_faceyz(faceyz,dims_25,iVar28,iVar39,iVar54,iVar46,ia,3,uVar13,
                                           in_stack_fffffffffffffcb0);
                      *pPVar32 = dVar72;
                      iVar27 = iVar18;
                      iVar28 = iVar19;
                      iVar29 = iVar22;
                      iVar30 = iVar21;
                      iVar57 = iVar47;
                      iVar58 = iVar61;
                    }
                  }
                  lVar48 = 0;
                  pPVar32 = local_70;
                  for (lVar59 = 0; pPVar35 = (P *)(ulong)uVar38, lVar59 != 2; lVar59 = lVar59 + 1) {
                    uVar14 = (uint)lVar59;
                    local_318 = uVar14 | 2;
                    uVar40 = local_1a0;
                    for (iVar18 = 0; iVar18 != 0x10; iVar18 = iVar18 + 1) {
                      if (bVar68) {
                        dVar71 = 0.0;
                        dVar78 = 0.0;
                        uVar43 = uVar40;
                        for (lVar44 = 0; lVar44 != 0x20; lVar44 = lVar44 + 4) {
                          iVar19 = (int)lVar44;
                          iVar22 = (int)uVar62;
                          dVar70 = 0.0;
                          dVar72 = 0.0;
                          dVar79 = 0.0;
                          dVar76 = 0.0;
                          if (iVar19 + iVar22 < iVar20) {
                            if (sweeper.dims_b.nm <= iVar18) goto LAB_00108744;
                            if (7 < uVar1) goto LAB_00108725;
                            if (pPVar8 == (P *)0x0) goto LAB_00108763;
                            dVar79 = pPVar8[lVar48 + lVar44 | 0x40] * m_from_a[uVar43];
                            dVar76 = pPVar32[lVar44 + -3] * m_from_a[uVar43];
                            pPVar35 = m_from_a;
                          }
                          if (iVar19 + iVar22 + 1 < iVar20) {
                            if (sweeper.dims_b.nm <= iVar18) goto LAB_00108744;
                            if (7 < uVar1) goto LAB_00108725;
                            if (pPVar8 == (P *)0x0) goto LAB_00108763;
                            dVar70 = *(double *)
                                      ((long)pPVar8 + ((lVar48 + lVar44) * 8 + 8U | 0x200)) *
                                     m_from_a[uVar43 + 0x10];
                            dVar72 = pPVar32[lVar44 + -2] * m_from_a[uVar43 + 0x10];
                            pPVar35 = m_from_a;
                          }
                          dVar77 = 0.0;
                          dVar73 = 0.0;
                          dVar74 = 0.0;
                          dVar75 = 0.0;
                          if (iVar19 + iVar22 + 2 < iVar20) {
                            if (sweeper.dims_b.nm <= iVar18) goto LAB_00108744;
                            if (7 < uVar1) goto LAB_00108725;
                            if (pPVar8 == (P *)0x0) goto LAB_00108763;
                            dVar74 = *(double *)
                                      ((long)pPVar8 + ((lVar48 + lVar44) * 8 + 0x10U | 0x200)) *
                                     m_from_a[uVar43 + 0x20];
                            dVar75 = pPVar32[lVar44 + -1] * m_from_a[uVar43 + 0x20];
                            pPVar35 = m_from_a;
                          }
                          if (iVar19 + iVar22 + 3 < iVar20) {
                            if (sweeper.dims_b.nm <= iVar18) {
LAB_00108744:
                              __assert_fail("im >= 0 && im < dims_nm",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                            ,0x1bf,
                                            "int ind_m_from_a_flat(const int, const int, const int, const int, const int)"
                                           );
                            }
                            if (7 < uVar1) {
LAB_00108725:
                              __assert_fail("octant >= 0 && octant < NOCTANT",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                            ,0x1c1,
                                            "int ind_m_from_a_flat(const int, const int, const int, const int, const int)"
                                           );
                            }
                            if (pPVar8 == (P *)0x0) {
LAB_00108763:
                              __assert_fail("v",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                            ,300,
                                            "const P *const_ref_vslocal(const P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                           );
                            }
                            dVar77 = *(double *)
                                      ((long)pPVar8 + ((lVar48 + lVar44) * 8 + 0x18U | 0x200)) *
                                     m_from_a[uVar43 + 0x30];
                            dVar73 = pPVar32[lVar44] * m_from_a[uVar43 + 0x30];
                            pPVar35 = m_from_a;
                          }
                          dVar71 = dVar71 + dVar79 + dVar70 + dVar74 + dVar77;
                          dVar78 = dVar78 + dVar76 + dVar72 + dVar75 + dVar73;
                          uVar43 = uVar43 + 0x40;
                        }
                        dims_26.ncell_y = iVar28;
                        dims_26.ncell_x = iVar27;
                        dims_26.ncell_z = iVar29;
                        dims_26.ne = iVar30;
                        dims_26.nm = iVar57;
                        dims_26.na = iVar58;
                        pPVar34 = ref_volocal(v,dims_26,iVar18,uVar14,uVar43,(int)pPVar35);
                        if (uVar62 == 0) {
                          *pPVar34 = dVar78;
                          dims_28.ncell_y = iVar28;
                          dims_28.ncell_x = iVar27;
                          dims_28.ncell_z = iVar29;
                          dims_28.ne = iVar30;
                          dims_28.nm = iVar57;
                          dims_28.na = iVar58;
                          pPVar34 = ref_volocal(v,dims_28,iVar18,local_318,uVar43,(int)pPVar35);
                          *pPVar34 = dVar71;
                        }
                        else {
                          *pPVar34 = dVar78 + *pPVar34;
                          dims_27.ncell_y = iVar28;
                          dims_27.ncell_x = iVar27;
                          dims_27.ncell_z = iVar29;
                          dims_27.ne = iVar30;
                          dims_27.nm = iVar57;
                          dims_27.na = iVar58;
                          pPVar34 = ref_volocal(v,dims_27,iVar18,local_318,uVar43,(int)pPVar35);
                          *pPVar34 = dVar71 + *pPVar34;
                        }
                        local_2d0 = (int)(uVar62 + 0x20);
                        if (iVar20 <= local_2d0) {
                          dims_29.ncell_y = iVar28;
                          dims_29.ncell_x = iVar27;
                          dims_29.ncell_z = iVar29;
                          dims_29.ne = iVar30;
                          dims_29.nm = iVar57;
                          dims_29.na = iVar58;
                          pPVar35 = ref_volocal(v,dims_29,iVar18,uVar14,uVar43,(int)pPVar35);
                          iVar21 = sweeper.dims_b.ne;
                          iVar22 = sweeper.dims_b.ncell_z;
                          iVar19 = sweeper.dims_b.ncell_y;
                          dVar71 = *pPVar35;
                          iVar47 = sweeper.dims_b.ncell_z;
                          iVar61 = sweeper.dims_b.ne;
                          iVar60 = iVar39;
                          iVar26 = iVar54;
                          iVar24 = iVar46;
                          pPVar35 = ref_state_flat(local_118,iVar17,sweeper.dims_b.ncell_y,
                                                   sweeper.dims_b.ncell_z,sweeper.dims_b.ne,iVar16,
                                                   iVar39,iVar54,iVar46,iVar18,uVar14,
                                                   in_stack_fffffffffffffcb0,uVar14);
                          iVar27 = iVar39;
                          iVar29 = iVar54;
                          iVar57 = iVar46;
                          in_stack_fffffffffffffca8 = local_318;
                          if (local_40 == 0) {
                            *pPVar35 = dVar71 + *pPVar35;
                            dims_31.ncell_y = iVar28;
                            dims_31.ncell_x = iVar60;
                            dims_31.ncell_z = iVar26;
                            dims_31.ne = iVar30;
                            dims_31.nm = iVar24;
                            dims_31.na = iVar58;
                            pPVar35 = ref_volocal(v,dims_31,iVar18,local_318,iVar47,iVar61);
                            dVar71 = *pPVar35;
                            pPVar35 = (P *)(ulong)(uint)iVar21;
                            pdVar36 = ref_state_flat(local_118,iVar17,iVar19,iVar22,iVar21,iVar16,
                                                     iVar39,iVar54,iVar46,iVar18,local_318,
                                                     in_stack_fffffffffffffcb0,uVar14);
                            dVar71 = dVar71 + *pdVar36;
                          }
                          else {
                            *pPVar35 = dVar71;
                            dims_30.ncell_y = iVar28;
                            dims_30.ncell_x = iVar60;
                            dims_30.ncell_z = iVar26;
                            dims_30.ne = iVar30;
                            dims_30.nm = iVar24;
                            dims_30.na = iVar58;
                            pPVar35 = ref_volocal(v,dims_30,iVar18,local_318,iVar47,iVar61);
                            dVar71 = *pPVar35;
                            pPVar35 = (P *)(ulong)(uint)iVar21;
                            pdVar36 = ref_state_flat(local_118,iVar17,iVar19,iVar22,iVar21,iVar16,
                                                     iVar39,iVar54,iVar46,iVar18,local_318,
                                                     in_stack_fffffffffffffcb0,uVar14);
                          }
                          *pdVar36 = dVar71;
                        }
                      }
                      uVar40 = uVar40 + 1;
                    }
                    lVar48 = lVar48 + 0x20;
                    pPVar32 = pPVar32 + 0x20;
                  }
                  local_238 = local_238 + 0x20;
                  local_228 = local_228 + 0x20;
                  local_230 = local_230 + 0x20;
                  local_1a0 = local_1a0 + 0x200;
                  uVar62 = uVar62 + 0x20;
                }
                uVar62 = local_90;
              }
            }
          }
        }
      }
    }
    uVar33 = local_170 + 1;
  } while( true );
}

Assistant:

TARGET_HD void Sweeper_sweep_block_impl(
  SweeperLite            sweeper,
        P* __restrict__  vo,
  const P* __restrict__  vi,
        P* __restrict__  facexy,
        P* __restrict__  facexz,
        P* __restrict__  faceyz,
  const P* __restrict__  a_from_m,
  const P* __restrict__  m_from_a,
  int                    step,
  const Quantities       quan,
  Bool_t                 proc_x_min,
  Bool_t                 proc_x_max,
  Bool_t                 proc_y_min,
  Bool_t                 proc_y_max,
  StepInfoAll            stepinfoall,
  unsigned long int      do_block_init )
{
  /*---Declarations---*/
    const int noctant_per_block = sweeper.noctant_per_block;

    const int nsemiblock = sweeper.nsemiblock;

    int semiblock_step = 0;

    /*=========================================================================
    =    OpenMP-parallelizing octants leads to the problem that for the same
    =    step, two octants may be updating the same location in a state vector.
    =
    =    One solution is to make the state vector update atomic, which is
    =    likely to be inefficient depending on the system.
    =
    =    The alternative used here is to break the step into sub steps
    =    and break the block into subregions such that during a sub-step,
    =    different octants in different threads update disjoint subregions.
    =
    =    First, note that octants are assigned to threads as follows:
    =      nthread_octant==1: one thread for all octants.
    =      nthread_octant==2: -x and +x octants assigned to different threads.
    =      nthread_octant==4: -y and +y octants also have different threads.
    =      nthread_octant==8: -z and +z octants also have different threads.
    =
    =    Along each coordinate axis for which two threads are assigned,
    =    the block is divided into two halves.  This gives a set of semiblocks.
    =
    =    The semiblocks are visited by the semiblock loop in an ordering
    =    which is lexicographical, either forward or reverse direction
    =    depending on the direction specified by that octant along the axis.
    =    This is set up so that (1) the disjointness condition described
    =    above holds, and (2) the cells are visited in an order that
    =    satisfies the sweep recursion.
    =
    =    NOTES:
    =    - For the unthreaded case, nsemiblock and noctant_per_block
    =      can be set to any of the allowed values and the algorithm will
    =      work properly.
    =    - If nsemiblock==noctant_per_block, then any value of nthread_octant
    =      applied to the OpenMP loop will work ok.
    =    - If nsemiblock<noctant_per_block==nthread_octant, then
    =      a potential race condition will occur.  This can be fixed by
    =      making the update of vo at the end of Sweeper_sweep_semiblock atomic.
    =      What is in question here is the overhead of the semiblock loop.
    =      One might want to reduce the number of semiblocks while keeping
    =      noctant_per_block==nthread_octant high to get more thread
    =      parallelism but possibly not too high so as to control the
    =      wavefront latency.
    =========================================================================*/

    /*--------------------*/
    /*---Loop over semiblock steps---*/
    /*--------------------*/

    for( semiblock_step=0; semiblock_step<nsemiblock; ++semiblock_step )
    {
#ifdef USE_OPENMP_TASKS
      /*--------------------*/
      /*---Enter parallel region where tasks will be launched---*/
      /*--------------------*/

      int thread_octant = 0;
      int thread_e = 0;

#pragma omp parallel for firstprivate(sweeper) collapse(2)
      for( thread_octant=0; thread_octant<sweeper.nthread_octant;
                                                             ++thread_octant)
      {
      for( thread_e=0; thread_e<sweeper.nthread_e; ++thread_e)
      {
        sweeper.thread_octant = thread_octant;
        sweeper.thread_e = thread_e;

      /*--------------------*/
      /*---Loop over the space of all tasks to be launched---*/
      /*--------------------*/

      /*---Here we assign one thread/task per subblock---*/

      int thread_z = 0;
      for( thread_z=0; thread_z<sweeper.nthread_z; ++thread_z)
      {
        sweeper.thread_z = thread_z;

      int thread_y = 0;
      for( thread_y=0; thread_y<sweeper.nthread_y; ++thread_y)
      {
        sweeper.thread_y = thread_y;

      int thread_x = 0;
      for( thread_x=0; thread_x<sweeper.nthread_x; ++thread_x)
      {
        sweeper.thread_x = thread_x;

      /*--------------------*/
      /*---Determine dependencies---*/
      /*--------------------*/

      const char* __restrict__ dep_in_x = Sweeper_task_dependency( &sweeper,
                thread_x-1, thread_y,   thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_y = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y-1, thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_z = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z-1, thread_e, thread_octant );

      const char* __restrict__ dep_out = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z,   thread_e, thread_octant );

      /*
        printf("%i %i "
               "Submitting task %i %i %i %i %i  thread %i numthreads %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num(), omp_get_num_threads());
      */

      /*--------------------*/
      /*---Launch this task---*/
      /*--------------------*/

#pragma omp task \
      depend(in:  dep_in_x[0]) \
      depend(in:  dep_in_y[0]) \
      depend(in:  dep_in_z[0]) \
      depend(out: dep_out[0])
      {
      /*
        printf("%i %i                   "
               "Commencing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */
#endif

      /*--------------------*/
      /*---Loop over octants in octant block---*/
      /*---That is, octants that are computed for this semiblock step---*/
      /*--------------------*/

        const int octant_in_block_min =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper )     ) )
                           /     sweeper.nthread_octant;
        const int octant_in_block_max =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper ) + 1 ) )
                           /     sweeper.nthread_octant;

        int octant_in_block = 0;

      for( octant_in_block=octant_in_block_min;
           octant_in_block<octant_in_block_max; ++octant_in_block )
      {
        /*---Get step info---*/

        const StepInfo stepinfo = stepinfoall.stepinfo[octant_in_block];

        const Bool_t is_octant_active = stepinfo.is_active;

        const int dir_x = Dir_x( stepinfo.octant );
        const int dir_y = Dir_y( stepinfo.octant );
        const int dir_z = Dir_z( stepinfo.octant );

        /*--------------------*/
        /*---Compute semiblock bounds---*/
        /*--------------------*/

        Bool_t is_semiblock_min_x = 0, is_semiblock_max_x = 0;
        int ixmin_semiblock = 0, ixmax_semiblock = 0, ixmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_x, &is_semiblock_max_x,
          &ixmin_semiblock, &ixmax_semiblock, &ixmax_semiblock_up2,
          sweeper.dims_b.ncell_x, DIM_X, dir_x, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_y = 0, is_semiblock_max_y = 0;
        int iymin_semiblock = 0, iymax_semiblock = 0, iymax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_y, &is_semiblock_max_y,
          &iymin_semiblock, &iymax_semiblock, &iymax_semiblock_up2,
          sweeper.dims_b.ncell_y, DIM_Y, dir_y, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_z = 0, is_semiblock_max_z = 0;
        int izmin_semiblock = 0, izmax_semiblock = 0, izmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_z, &is_semiblock_max_z,
          &izmin_semiblock, &izmax_semiblock, &izmax_semiblock_up2,
          sweeper.dims_b.ncell_z, DIM_Z, dir_z, semiblock_step, nsemiblock);

        /*--------------------*/
        /*---Perform sweep over subblocks in semiblock---*/
        /*---(for tasking case, this task sweeps one subblock in semiblock---*/
        /*--------------------*/

        const int iz_base = stepinfo.block_z * sweeper.dims_b.ncell_z;

        const P* vi_this = const_ref_state( vi, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );
        P* vo_this =             ref_state( vo, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );

        const int do_block_init_this = !! ( do_block_init &
                         ( ((unsigned long int)1) <<
                           ( octant_in_block + noctant_per_block *
                             semiblock_step ) ) );

        Sweeper_sweep_semiblock( &sweeper, vo_this, vi_this,
                                 facexy, facexz, faceyz,
                                 a_from_m, m_from_a,
                                 &quan, stepinfo, octant_in_block,
                                 ixmin_semiblock, ixmax_semiblock_up2,
                                 iymin_semiblock, iymax_semiblock_up2,
                                 izmin_semiblock, izmax_semiblock_up2,
                                 do_block_init_this,
                                 is_octant_active );

      } /*---octant_in_block---*/

#ifdef USE_OPENMP_TASKS
      /*
        printf("%i %i                                                 "
               "Completing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */

      } /*---omp task---*/
      }
      }
      }
      }
      } /*---omp parallel for---*/ /*---NOTE: implicit sync here---*/
#else
      /*---Sync between semiblock steps---*/
      Sweeper_sync_octant_threads( &sweeper );
#endif

    } /*---semiblock---*/
}